

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O3

void print_state(void *data)

{
  bool bVar1;
  char *pcVar2;
  int __c;
  map_int_t *pmVar3;
  
  pcVar2 = " !";
  if (*(char *)((long)data + 1) == '\0') {
    pcVar2 = "";
  }
  printf("%s --state",pcVar2);
  if (m_state[0].k != (char *)0x0) {
    pmVar3 = m_state;
    bVar1 = false;
    do {
      pmVar3 = pmVar3 + 1;
      if ((pmVar3[-1].v & (uint)*data) != 0) {
        __c = 0x2c;
        if (!bVar1) {
          __c = 0x20;
        }
        putchar(__c);
        printf("%s",pmVar3[-1].k);
        bVar1 = true;
      }
    } while (pmVar3->k != (char *)0x0);
  }
  return;
}

Assistant:

static void print_state(void *data)
{
	match_state_t *m = (match_state_t *)data;
	int have = 0;

	printf("%s --state", m->invert ? " !" : "");

	for (int i = 0; m_state[i].k != NULL; i++) {
		if (m->state & m_state[i].v) {
			if (have) {
				printf(",");
			} else {
				printf(" ");
			}

			printf("%s", m_state[i].k);
			have = 1;
		}
	}
}